

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

char * zip_basename(char *name)

{
  bool bVar1;
  char *pcStack_20;
  int all_slashes;
  char *base;
  char *p;
  char *name_local;
  
  bVar1 = true;
  pcStack_20 = name;
  for (base = name; *base != '\0'; base = base + 1) {
    if ((*base == '/') || (*base == '\\')) {
      pcStack_20 = base + 1;
    }
    else {
      bVar1 = false;
    }
  }
  if ((*pcStack_20 == '\0') && (((*name == '/' || (*name == '\\')) && (bVar1)))) {
    pcStack_20 = pcStack_20 + -1;
  }
  return pcStack_20;
}

Assistant:

static const char *zip_basename(const char *name) {
  char const *p;
  char const *base = name += FILESYSTEM_PREFIX_LEN(name);
  int all_slashes = 1;

  for (p = name; *p; p++) {
    if (ISSLASH(*p))
      base = p + 1;
    else
      all_slashes = 0;
  }

  /* If NAME is all slashes, arrange to return `/'. */
  if (*base == '\0' && ISSLASH(*name) && all_slashes)
    --base;

  return base;
}